

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

double amrex::second(void)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  return (double)(lVar1 - _ZN12_GLOBAL__N_116clock_time_beginE_0) / 1000000000.0;
}

Assistant:

double amrex::second () noexcept
{
    return std::chrono::duration_cast<std::chrono::duration<double> >
        (amrex::MaxResSteadyClock::now() - clock_time_begin).count();
}